

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_bool nk_chart_begin_colored
                  (nk_context *ctx,nk_chart_type type,nk_color color,nk_color highlight,int count,
                  float min_value,float max_value)

{
  nk_vec2 nVar1;
  nk_panel *pnVar2;
  nk_rect r;
  undefined1 auVar3 [16];
  nk_widget_layout_states nVar4;
  nk_bool nVar5;
  ulong __n;
  nk_chart *__s;
  int iVar6;
  size_t sVar7;
  size_t __n_00;
  nk_window *pnVar8;
  nk_command_buffer *b;
  float fVar12;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar13;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect bounds;
  nk_rect local_78;
  nk_color local_64;
  int local_60;
  nk_color local_5c;
  nk_rect local_58;
  float local_48;
  float fStack_44;
  undefined8 uStack_40;
  nk_window *local_38;
  
  local_78.x = 0.0;
  local_78.y = 0.0;
  local_78.w = 0.0;
  local_78.h = 0.0;
  nVar5 = 0;
  if (((ctx != (nk_context *)0x0) && (nVar5 = 0, ctx->current != (nk_window *)0x0)) &&
     (ctx->current->layout != (nk_panel *)0x0)) {
    local_58.x = min_value;
    local_64 = color;
    local_60 = count;
    local_5c = highlight;
    local_48 = max_value;
    nVar4 = nk_widget(&local_78,ctx);
    pnVar8 = ctx->current;
    pnVar2 = pnVar8->layout;
    __s = &pnVar2->chart;
    if (nVar4 == NK_WIDGET_INVALID) {
      sVar7 = (ulong)__s & 3;
      if (sVar7 == 0) {
        sVar7 = 0xb4;
      }
      else {
        __n_00 = -sVar7 + 4;
        memset(__s,0,__n_00);
        memset((void *)((long)__s + __n_00),0,0xb0);
        __s = (nk_chart *)((long)__s + -sVar7 + 0xb4);
      }
      nVar5 = 0;
      memset(__s,0,sVar7);
    }
    else {
      __n = (ulong)__s & 3;
      if (__n == 0) {
        iVar6 = 0;
        memset((pnVar2->chart).slots,0,0xa0);
      }
      else {
        sVar7 = -__n + 4;
        local_38 = pnVar8;
        memset(__s,0,sVar7);
        memset((void *)((long)__s + sVar7),0,0xb0);
        pnVar8 = local_38;
        memset((void *)((long)__s + -__n + 0xb4),0,__n);
        iVar6 = __s->slot;
      }
      nVar1 = (ctx->style).chart.padding;
      fVar13 = nVar1.x;
      fVar12 = nVar1.y;
      (pnVar2->chart).x = local_78.x + fVar13;
      (pnVar2->chart).y = local_78.y + fVar12;
      fStack_44 = local_78.h;
      auVar9._0_4_ = fVar13 + fVar13;
      auVar9._4_4_ = fVar12 + fVar12;
      auVar9._8_8_ = 0;
      auVar10._4_4_ = fStack_44 - auVar9._4_4_;
      auVar10._0_4_ = local_78.w - auVar9._0_4_;
      auVar10._8_8_ = 0;
      auVar10 = maxps(auVar9,auVar10);
      (pnVar2->chart).w = (float)(int)auVar10._0_8_;
      (pnVar2->chart).h = (float)(int)((ulong)auVar10._0_8_ >> 0x20);
      (pnVar2->chart).slot = iVar6 + 1;
      (pnVar2->chart).slots[iVar6].type = type;
      (pnVar2->chart).slots[iVar6].count = local_60;
      (pnVar2->chart).slots[iVar6].color = local_64;
      (pnVar2->chart).slots[iVar6].highlight = local_5c;
      fVar13 = local_58.x;
      if (local_48 <= local_58.x) {
        fVar13 = local_48;
      }
      (pnVar2->chart).slots[iVar6].min = fVar13;
      fVar12 = local_48;
      if (local_48 <= local_58.x) {
        fVar12 = local_58.x;
      }
      (pnVar2->chart).slots[iVar6].max = fVar12;
      (pnVar2->chart).slots[iVar6].range = fVar12 - fVar13;
      b = &pnVar8->buffer;
      if ((ctx->style).chart.background.type == NK_STYLE_ITEM_IMAGE) {
        r.w = local_78.w;
        r.h = local_78.h;
        r.x = local_78.x;
        r.y = local_78.y;
        nk_draw_image(b,r,&(ctx->style).chart.background.data.image,(nk_color)0xffffffff);
      }
      else {
        local_58.x = local_78.x;
        local_58.y = local_78.y;
        local_58.w = 0.0;
        local_58.h = 0.0;
        uStack_40 = 0;
        rect.w = local_78.w;
        rect.h = local_78.h;
        rect.x = local_78.x;
        rect.y = local_78.y;
        local_48 = local_78.w;
        nk_fill_rect(b,rect,(ctx->style).chart.rounding,(ctx->style).chart.border_color);
        fVar13 = (ctx->style).chart.border;
        rect_00.x = fVar13 + local_58.x;
        rect_00.y = fVar13 + local_58.y;
        fVar13 = fVar13 + fVar13;
        auVar11._4_4_ = fVar13;
        auVar11._0_4_ = fVar13;
        auVar11._8_4_ = fVar13;
        auVar11._12_4_ = fVar13;
        auVar3._4_4_ = fStack_44;
        auVar3._0_4_ = local_48;
        auVar3._8_8_ = uStack_40;
        auVar10 = maxps(auVar11,auVar3);
        rect_00.w = auVar10._0_4_ - fVar13;
        rect_00.h = auVar10._4_4_ - fVar13;
        nk_fill_rect(b,rect_00,(ctx->style).chart.rounding,(ctx->style).chart.background.data.color)
        ;
      }
      nVar5 = 1;
    }
  }
  return nVar5;
}

Assistant:

NK_API nk_bool
nk_chart_begin_colored(struct nk_context *ctx, enum nk_chart_type type,
struct nk_color color, struct nk_color highlight,
int count, float min_value, float max_value)
{
struct nk_window *win;
struct nk_chart *chart;
const struct nk_style *config;
const struct nk_style_chart *style;

const struct nk_style_item *background;
struct nk_rect bounds = {0, 0, 0, 0};

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);

if (!ctx || !ctx->current || !ctx->current->layout) return 0;
if (!nk_widget(&bounds, ctx)) {
chart = &ctx->current->layout->chart;
nk_zero(chart, sizeof(*chart));
return 0;
}

win = ctx->current;
config = &ctx->style;
chart = &win->layout->chart;
style = &config->chart;

/* setup basic generic chart  */
nk_zero(chart, sizeof(*chart));
chart->x = bounds.x + style->padding.x;
chart->y = bounds.y + style->padding.y;
chart->w = bounds.w - 2 * style->padding.x;
chart->h = bounds.h - 2 * style->padding.y;
chart->w = NK_MAX(chart->w, 2 * style->padding.x);
chart->h = NK_MAX(chart->h, 2 * style->padding.y);

/* add first slot into chart */
{struct nk_chart_slot *slot = &chart->slots[chart->slot++];
slot->type = type;
slot->count = count;
slot->color = color;
slot->highlight = highlight;
slot->min = NK_MIN(min_value, max_value);
slot->max = NK_MAX(min_value, max_value);
slot->range = slot->max - slot->min;}

/* draw chart background */
background = &style->background;
if (background->type == NK_STYLE_ITEM_IMAGE) {
nk_draw_image(&win->buffer, bounds, &background->data.image, nk_white);
} else {
nk_fill_rect(&win->buffer, bounds, style->rounding, style->border_color);
nk_fill_rect(&win->buffer, nk_shrink_rect(bounds, style->border),
style->rounding, style->background.data.color);
}
return 1;
}